

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall bpptr::incwch(bpptr *this)

{
  ulong uVar1;
  size_t sVar2;
  
  if (this->len != 0) {
    sVar2 = utf8_ptr::s_charsize(*this->p);
    uVar1 = this->len;
    if (uVar1 <= sVar2) {
      sVar2 = uVar1;
    }
    this->p = this->p + sVar2;
    this->len = uVar1 - sVar2;
  }
  return;
}

Assistant:

void incwch()
    {
        if (len != 0)
        {
            size_t clen = utf8_ptr::s_charsize(*p);
            if (clen > len)
                clen = len;
            p += clen;
            len -= clen;
        }
    }